

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

char  [7] __thiscall
kj::_::Debug::makeDescription<unsigned_long&>(Debug *this,char *macroArgs,unsigned_long *params)

{
  ArrayPtr<kj::String> argValues_00;
  char argValues [1] [7];
  
  str<unsigned_long&>((String *)argValues,(kj *)params,params);
  argValues_00.size_ = 1;
  argValues_00.ptr = (String *)argValues;
  makeDescriptionInternal((String *)this,macroArgs,argValues_00);
  Array<char>::~Array((Array<char> *)argValues);
  return SUB87(this,0);
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}